

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

bool __thiscall reflection::Field::Verify(Field *this,Verifier *verifier)

{
  bool bVar1;
  String *str;
  Type *table;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar2;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar3;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    str = name(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,6), bVar1)) {
      table = type(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTable<reflection::Type>(verifier,table);
      if ((((((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyField<unsigned_short>
                                (&this->super_Table,verifier,8,2), bVar1)) &&
            (bVar1 = flatbuffers::Table::VerifyField<unsigned_short>
                               (&this->super_Table,verifier,10,2), bVar1)) &&
           (((bVar1 = flatbuffers::Table::VerifyField<long>(&this->super_Table,verifier,0xc,8),
             bVar1 && (bVar1 = flatbuffers::Table::VerifyField<double>
                                         (&this->super_Table,verifier,0xe,8), bVar1)) &&
            (bVar1 = flatbuffers::Table::VerifyField<unsigned_char>
                               (&this->super_Table,verifier,0x10,1), bVar1)))) &&
          ((bVar1 = flatbuffers::Table::VerifyField<unsigned_char>
                              (&this->super_Table,verifier,0x12,1), bVar1 &&
           (bVar1 = flatbuffers::Table::VerifyField<unsigned_char>
                              (&this->super_Table,verifier,0x14,1), bVar1)))) &&
         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0x16),
         bVar1)) {
        pVVar2 = attributes(this);
        bVar1 = flatbuffers::VerifierTemplate<false>::
                VerifyVector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>
                          (verifier,pVVar2);
        if (bVar1) {
          pVVar2 = attributes(this);
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                            (verifier,pVVar2);
          if ((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0x18), bVar1)) {
            pVVar3 = documentation(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::
                    VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                              (verifier,pVVar3);
            if (bVar1) {
              pVVar3 = documentation(this);
              bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,pVVar3);
              if ((((bVar1) &&
                   (bVar1 = flatbuffers::Table::VerifyField<unsigned_char>
                                      (&this->super_Table,verifier,0x1a,1), bVar1)) &&
                  (bVar1 = flatbuffers::Table::VerifyField<unsigned_short>
                                     (&this->super_Table,verifier,0x1c,2), bVar1)) &&
                 (bVar1 = flatbuffers::Table::VerifyField<unsigned_char>
                                    (&this->super_Table,verifier,0x1e,1), bVar1)) {
                verifier->depth_ = verifier->depth_ - 1;
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffsetRequired(verifier, VT_TYPE) &&
           verifier.VerifyTable(type()) &&
           VerifyField<uint16_t>(verifier, VT_ID, 2) &&
           VerifyField<uint16_t>(verifier, VT_OFFSET, 2) &&
           VerifyField<int64_t>(verifier, VT_DEFAULT_INTEGER, 8) &&
           VerifyField<double>(verifier, VT_DEFAULT_REAL, 8) &&
           VerifyField<uint8_t>(verifier, VT_DEPRECATED, 1) &&
           VerifyField<uint8_t>(verifier, VT_REQUIRED, 1) &&
           VerifyField<uint8_t>(verifier, VT_KEY, 1) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyField<uint8_t>(verifier, VT_OPTIONAL, 1) &&
           VerifyField<uint16_t>(verifier, VT_PADDING, 2) &&
           VerifyField<uint8_t>(verifier, VT_OFFSET64, 1) &&
           verifier.EndTable();
  }